

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codecompiler.cpp
# Opt level: O3

Error __thiscall
asmjit::CodeCompiler::_newReg(CodeCompiler *this,Reg *out,uint32_t typeId,char *name)

{
  Error EVar1;
  VirtReg *pVVar2;
  UInt64 UVar3;
  RegInfo regInfo;
  RegInfo local_20;
  uint32_t local_1c;
  
  local_1c = typeId;
  EVar1 = ArchUtils::typeIdToRegInfo
                    ((uint)(this->super_CodeBuilder).super_CodeEmitter._codeInfo._archInfo.field_0.
                           field_0._type,&local_1c,&local_20);
  if (EVar1 == 0) {
    pVVar2 = newVirtReg(this,local_1c,local_20._signature,name);
    if (pVVar2 != (VirtReg *)0x0) {
      UVar3.i32[1] = pVVar2->_id;
      UVar3.u32[0] = local_20._signature;
      (out->super_Operand).super_Operand_.field_0._packed[0] = UVar3;
      (out->super_Operand).super_Operand_.field_0._mem.field_2.offset64 = 0;
      return 0;
    }
    EVar1 = 1;
    (out->super_Operand).super_Operand_.field_0._packed[0] = (UInt64)0x0;
    (out->super_Operand).super_Operand_.field_0._mem.field_2.offset64 = 0;
  }
  EVar1 = CodeEmitter::setLastError((CodeEmitter *)this,EVar1,(char *)0x0);
  return EVar1;
}

Assistant:

Error CodeCompiler::_newReg(Reg& out, uint32_t typeId, const char* name) {
  RegInfo regInfo;

  Error err = ArchUtils::typeIdToRegInfo(getArchType(), typeId, regInfo);
  if (ASMJIT_UNLIKELY(err)) return setLastError(err);

  VirtReg* vReg = newVirtReg(typeId, regInfo.getSignature(), name);
  if (ASMJIT_UNLIKELY(!vReg)) {
    out.reset();
    return setLastError(DebugUtils::errored(kErrorNoHeapMemory));
  }

  out._initReg(regInfo.getSignature(), vReg->getId());
  return kErrorOk;
}